

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::updatePaintedViewBoundingRects(QGraphicsItemPrivate *this,bool updateChildren)

{
  long lVar1;
  QGraphicsScenePrivate *pQVar2;
  qsizetype qVar3;
  QList<QGraphicsItem_*> *this_00;
  const_reference ppQVar4;
  long lVar5;
  undefined1 in_SIL;
  QWidget **in_RDI;
  long in_FS_OFFSET;
  QRect QVar6;
  int i_1;
  QGraphicsViewPrivate *viewPrivate;
  int i;
  QRect rect;
  QPoint *in_stack_ffffffffffffffa8;
  QRect *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar7;
  QGraphicsViewPrivate *in_stack_ffffffffffffffd0;
  int iVar8;
  undefined3 in_stack_ffffffffffffffdc;
  uint uVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = CONCAT13(in_SIL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  if (in_RDI[0x11] != (QWidget *)0x0) {
    iVar8 = 0;
    while( true ) {
      lVar5 = (long)iVar8;
      pQVar2 = QGraphicsScene::d_func((QGraphicsScene *)0x979910);
      qVar3 = QList<QGraphicsView_*>::size(&pQVar2->views);
      if (qVar3 <= lVar5) break;
      QGraphicsScene::d_func((QGraphicsScene *)0x979941);
      QList<QGraphicsView_*>::at
                ((QList<QGraphicsView_*> *)in_stack_ffffffffffffffb0,
                 (qsizetype)in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffd0 = QGraphicsView::d_func((QGraphicsView *)0x97995d);
      QVar6 = QHash<QWidget_*,_QRect>::value
                        ((QHash<QWidget_*,_QRect> *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI);
      QRect::translate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      QGraphicsViewPrivate::updateRect(QVar6._8_8_,QVar6._0_8_);
      iVar8 = iVar8 + 1;
    }
    if ((uVar9 & 0x1000000) != 0) {
      iVar7 = 0;
      while( true ) {
        this_00 = (QList<QGraphicsItem_*> *)(long)iVar7;
        qVar3 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x13));
        if (qVar3 <= (long)this_00) break;
        ppQVar4 = QList<QGraphicsItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffa8);
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&(*ppQVar4)->d_ptr);
        updatePaintedViewBoundingRects
                  ((QGraphicsItemPrivate *)CONCAT44(uVar9,iVar8),
                   SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x38,0));
        iVar7 = iVar7 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::updatePaintedViewBoundingRects(bool updateChildren)
{
    if (!scene)
        return;

    for (int i = 0; i < scene->d_func()->views.size(); ++i) {
        QGraphicsViewPrivate *viewPrivate = scene->d_func()->views.at(i)->d_func();
        QRect rect = paintedViewBoundingRects.value(viewPrivate->viewport);
        rect.translate(viewPrivate->dirtyScrollOffset);
        viewPrivate->updateRect(rect);
    }

    if (updateChildren) {
        for (int i = 0; i < children.size(); ++i)
            children.at(i)->d_ptr->updatePaintedViewBoundingRects(true);
    }
}